

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenBinarySchemaTypeDef(CppGenerator *this,StructDef *struct_def)

{
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((struct_def != (StructDef *)0x0) &&
     ((this->opts_).super_IDLOptions.binary_schema_gen_embed == true)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_99);
    BaseGenerator::WrapInNameSpace
              (&local_98,&this->super_BaseGenerator,&struct_def->super_Definition,&local_38);
    std::operator+(&local_78,"  typedef ",&local_98);
    std::operator+(&local_58,&local_78,"BinarySchema BinarySchema;");
    CodeWriter::operator+=(&this->code_,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void GenBinarySchemaTypeDef(const StructDef *struct_def) {
    if (struct_def && opts_.binary_schema_gen_embed) {
      code_ += "  typedef " + WrapInNameSpace(*struct_def) +
               "BinarySchema BinarySchema;";
    }
  }